

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.h
# Opt level: O0

void __thiscall Channel::handleEvents(Channel *this)

{
  bool bVar1;
  Channel *in_RDI;
  
  in_RDI->events_ = 0;
  if (((in_RDI->revents_ & 0x10) == 0) || ((in_RDI->revents_ & 1) != 0)) {
    if ((in_RDI->revents_ & 8) == 0) {
      if ((in_RDI->revents_ & 0x2003) != 0) {
        handleRead(in_RDI);
      }
      if ((in_RDI->revents_ & 4) != 0) {
        handleWrite(in_RDI);
      }
      handleConn(in_RDI);
    }
    else {
      bVar1 = std::function::operator_cast_to_bool((function<void_()> *)in_RDI);
      if (bVar1) {
        std::function<void_()>::operator()((function<void_()> *)in_RDI);
      }
      in_RDI->events_ = 0;
    }
  }
  else {
    in_RDI->events_ = 0;
  }
  return;
}

Assistant:

void handleEvents(){
        events_=0;
        if((revents_&EPOLLHUP)&&!(revents_&EPOLLIN)){
            events_=0;
            return;
        }
        if(revents_&EPOLLERR){
            if(errorHandler_) errorHandler_();
            events_=0;
            return;
        }
        if (revents_&(EPOLLIN|EPOLLPRI|EPOLLRDHUP)) {
            handleRead();
        }
        if(revents_&(EPOLLOUT)){
            handleWrite();
        }
        handleConn();
    }